

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_opengl.h
# Opt level: O1

bool djgp__attach_shader(GLuint program,GLenum shader_t,GLsizei count,GLchar **source)

{
  GLint GVar1;
  GLuint GVar2;
  GLchar *__ptr;
  GLint logc;
  GLint compiled;
  GLint local_30;
  int local_2c;
  
  GVar2 = (*glad_glCreateShader)(shader_t);
  (*glad_glShaderSource)(GVar2,count,source,(GLint *)0x0);
  (*glad_glCompileShader)(GVar2);
  (*glad_glGetShaderiv)(GVar2,0x8b81,&local_2c);
  if (local_2c == 0) {
    local_30 = 0;
    (*glad_glGetShaderiv)(GVar2,0x8b84,&local_30);
    GVar1 = local_30;
    __ptr = (GLchar *)malloc((long)local_30);
    (*glad_glGetShaderInfoLog)(GVar2,GVar1,(GLsizei *)0x0,__ptr);
    fprintf(_stdout,
            "djg_error: Shader compilation failed\n-- Begin -- GLSL Compiler Info Log\n%s\n-- End -- GLSL Compiler Info Log\n"
            ,__ptr);
    fflush(_stdout);
    free(__ptr);
  }
  else {
    (*glad_glAttachShader)(program,GVar2);
  }
  (*glad_glDeleteShader)(GVar2);
  return local_2c != 0;
}

Assistant:

static bool
djgp__attach_shader(
    GLuint program,
    GLenum shader_t,
    GLsizei count,
    const GLchar **source
) {
    GLint compiled;
    GLuint shader = glCreateShader(shader_t);

    // set source and compile
    glShaderSource(shader, count, source, NULL);
    glCompileShader(shader);

    // check compilation
    glGetShaderiv(shader, GL_COMPILE_STATUS, &compiled);
    if (!compiled) {
        GLint logc = 0;
        GLchar *logv = NULL;

        // retrieve GLSL compiler information and log
        glGetShaderiv(shader, GL_INFO_LOG_LENGTH, &logc);
        logv = (GLchar *)DJG_MALLOC(logc);
        glGetShaderInfoLog(shader, logc, NULL, logv);
        DJG_LOG("djg_error: Shader compilation failed\n"\
                "-- Begin -- GLSL Compiler Info Log\n"          \
                "%s\n"                                          \
                "-- End -- GLSL Compiler Info Log\n", logv);
        DJG_FREE(logv);

        glDeleteShader(shader);
        return false;
    }

    // attach shader and flag for deletion
    glAttachShader(program, shader);
    glDeleteShader(shader);
    return true;
}